

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intUtil.c
# Opt level: O3

int Inter_ManCheckInitialState(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Abc_Cex_t *pAVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  
  p_00 = Cnf_Derive(p,p->nRegs);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,1);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p_00);
    uVar7 = 0;
  }
  else {
    iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar3 == 1) {
      pAVar4 = Abc_CexAlloc(p->nRegs,p->nTruePis,1);
      p->pSeqModel = pAVar4;
      iVar5 = p->nTruePis;
      if (0 < iVar5) {
        pVVar2 = p->vCis;
        lVar6 = 0;
        do {
          if (pVVar2->nSize <= lVar6) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar1 = p_00->pVarNums[*(int *)((long)pVVar2->pArray[lVar6] + 0x24)];
          if (((long)iVar1 < 0) || (s->size <= iVar1)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                          ,0xcd,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (s->model[iVar1] == 1) {
            iVar5 = p->nRegs + (int)lVar6;
            (&pAVar4[1].iPo)[iVar5 >> 5] = (&pAVar4[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
            iVar5 = p->nTruePis;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar5);
      }
    }
    uVar7 = (uint)(iVar3 == 1);
    Cnf_DataFree(p_00);
    sat_solver_delete(s);
  }
  return uVar7;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Returns 1 if the property fails in the initial state.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Inter_ManCheckInitialState( Aig_Man_t * p )
{
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    sat_solver * pSat;
    int i, status;
    //abctime clk = Abc_Clock();
    pCnf = Cnf_Derive( p, Saig_ManRegNum(p) ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 1 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return 0;
    }
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    //ABC_PRT( "Time", Abc_Clock() - clk );
    if ( status == l_True )
    {
        p->pSeqModel = Abc_CexAlloc( Aig_ManRegNum(p), Saig_ManPiNum(p), 1 );
        Saig_ManForEachPi( p, pObj, i )
            if ( sat_solver_var_value( pSat, pCnf->pVarNums[Aig_ObjId(pObj)] ) )
                Abc_InfoSetBit( p->pSeqModel->pData, Aig_ManRegNum(p) + i );
    }
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    return status == l_True;
}